

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O1

bool __thiscall CPubKey::IsFullyValid(CPubKey *this)

{
  byte bVar1;
  int iVar2;
  size_t inputlen;
  long in_FS_OFFSET;
  bool bVar3;
  secp256k1_pubkey pubkey;
  secp256k1_pubkey sStack_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) != 2) {
    bVar3 = false;
    if ((7 < bVar1) || (bVar3 = false, (0xd0U >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_008362af;
  }
  inputlen = 0x21;
  if ((bVar1 & 0xfe) != 2) {
    if ((byte)(bVar1 - 4) < 4) {
      inputlen = (&DAT_00e5ea00)[(byte)(bVar1 - 4)];
    }
    else {
      inputlen = 0;
    }
  }
  iVar2 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&sStack_48,this->vch,inputlen);
  bVar3 = iVar2 != 0;
LAB_008362af:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::IsFullyValid() const {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    return secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size());
}